

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::SetSourceDirectory(cmState *this,string *sourceDirectory)

{
  string *path;
  string local_38;
  string *local_18;
  string *sourceDirectory_local;
  cmState *this_local;
  
  path = &this->SourceDirectory;
  local_18 = sourceDirectory;
  sourceDirectory_local = (string *)this;
  std::__cxx11::string::operator=((string *)path,(string *)sourceDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_38,path);
  cmsys::SystemTools::SplitPath(&local_38,&this->SourceDirectoryComponents,true);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmState::SetSourceDirectory(std::string const& sourceDirectory)
{
  this->SourceDirectory = sourceDirectory;
  cmSystemTools::ConvertToUnixSlashes(this->SourceDirectory);

  cmSystemTools::SplitPath(
      cmSystemTools::CollapseFullPath(this->SourceDirectory),
        this->SourceDirectoryComponents);
}